

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O3

void __thiscall KosarajuSCC::DFS(KosarajuSCC *this,int v,bool *visited,int curr)

{
  vector<int,std::allocator<int>> *this_00;
  uint uVar1;
  iterator __position;
  pointer pvVar2;
  bool bVar3;
  int iVar4;
  pointer piVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int local_2c;
  
  lVar6 = (long)v;
  visited[lVar6] = true;
  (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [lVar6] = curr;
  this_00 = (vector<int,std::allocator<int>> *)
            ((this->sccs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + curr);
  __position._M_current = *(int **)(this_00 + 8);
  local_2c = v;
  if (__position._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (this_00,__position,&local_2c);
    lVar6 = (long)local_2c;
  }
  else {
    *__position._M_current = v;
    *(int **)(this_00 + 8) = __position._M_current + 1;
  }
  pvVar2 = (this->ingoing).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = pvVar2[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar2[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      uVar1 = piVar5[uVar7];
      iVar4 = (*this->_vptr_KosarajuSCC[2])(this,(ulong)uVar1);
      if ((char)iVar4 == '\0') {
        uVar1 = **(uint **)&(this->ends).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
        iVar4 = (*this->_vptr_KosarajuSCC[3])(this,(ulong)uVar1);
        if (((char)iVar4 == '\0') && (visited[(int)uVar1] == false)) {
          DFS(this,uVar1,visited,curr);
        }
      }
      pvVar2 = (this->ingoing).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar8 < (ulong)((long)pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

void KosarajuSCC::DFS(int v, bool visited[], int curr) {
	// Mark the current node as visited and print it
	visited[v] = true;
	scc[v] = curr;
	sccs[curr].push_back(v);
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < ingoing[v].size(); ++i) {
		const int e = ingoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][0];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			DFS(u, visited, curr);
		}
	}
}